

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtiming.cpp
# Opt level: O2

void print_event_count_proc(Am_Object *interp)

{
  int iVar1;
  Am_Value *value;
  long lVar2;
  ostream *poVar3;
  Am_Time stop;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object_Method local_20;
  
  Am_Object::Get_Prototype();
  value = (Am_Value *)Am_Object::Get((ushort)&local_30,0xca);
  Am_Object_Method::Am_Object_Method(&local_20,value);
  Am_Object::Am_Object(&local_28,interp);
  (*local_20.Call)((Am_Object_Data *)&local_28);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  iVar1 = (int)event_count;
  Am_Time::Now();
  Am_Time::operator-((Am_Time *)&local_30,(Am_Time *)&local_20);
  lVar2 = Am_Time::Milliseconds();
  Am_Time::~Am_Time((Am_Time *)&local_30);
  poVar3 = std::operator<<((ostream *)&std::cout,"Animation constraint executed ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," steps in ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"for average cost of ");
  poVar3 = std::ostream::_M_insert<double>((double)lVar2 / (double)iVar1);
  poVar3 = std::operator<<(poVar3," ms per iteration.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  Am_Exit_Main_Event_Loop();
  Am_Time::~Am_Time((Am_Time *)&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, print_event_count, (Am_Object interp))
{
  Am_Object_Method(interp.Get_Prototype().Get(Am_DO_METHOD)).Call(interp);

  int n = event_count;
  Am_Time stop = Am_Time::Now();

  long ms = (stop - start).Milliseconds();

  std::cout << "Animation constraint executed " << n << " steps in " << ms
            << std::endl
            << "for average cost of " << double(ms) / n << " ms per iteration."
            << std::endl
            << std::flush;

  Am_Exit_Main_Event_Loop();
}